

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void place_random_engraving(level *lev,char **engravings,int size)

{
  char *s;
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  xchar x;
  char y;
  
  uVar2 = mt_random();
  s = engravings[uVar2 % 10];
  uVar2 = 0;
  do {
    bVar1 = In_hell(&u.uz);
    if ((bVar1 == '\0') && (iVar5 = lev->nroom, 1 < (long)iVar5)) {
      uVar3 = mt_random();
      iVar4 = somex(lev->rooms + SUB168(ZEXT416(uVar3) % SEXT816((long)iVar5 + -1),0));
      x = (xchar)iVar4;
      iVar5 = somey(lev->rooms + SUB168(ZEXT416(uVar3) % SEXT816((long)iVar5 + -1),0));
      y = (char)iVar5;
    }
    else {
      uVar3 = mt_random();
      x = (xchar)(uVar3 % 0x50);
      uVar3 = mt_random();
      y = (char)(uVar3 % 0x15);
    }
    bVar1 = occupied(lev,x,y);
    if (bVar1 == '\0') goto LAB_001da824;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x65);
  uVar2 = 0x65;
LAB_001da824:
  if (uVar2 < 100) {
    make_engr_at(lev,(int)x,(int)y,s,0,'\x03');
    return;
  }
  return;
}

Assistant:

static void place_random_engraving(struct level *lev, const char *const engravings[],
				   const int size)
{
	struct mkroom *some_room;
	xchar sx, sy;
	int tries = 0;
	char const *engraving = engravings[rn2(size)];

	do {
	    if (Inhell || lev->nroom <= 1) {
		/* random placement in Gehennom or levels with no rooms */
		sx = rn2(COLNO);
		sy = rn2(ROWNO);
	    } else {
		/* placement inside of rooms, not corridors */
		some_room = &lev->rooms[rn2(lev->nroom - 1)];
		sx = somex(some_room);
		sy = somey(some_room);
	    }
	} while (occupied(lev, sx, sy) && tries++ < 100);

	if (tries < 100)
	    make_engr_at(lev, sx, sy, engraving, 0L, BURN);
}